

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

void __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
TransferList(InnerMap *this,void **table,size_type index)

{
  Node *pNVar1;
  size_t sVar2;
  Node *node;
  iterator iStack_38;
  
  node = (Node *)table[index];
  do {
    pNVar1 = node->next;
    sVar2 = hash<google::protobuf::MapKey>::operator()
                      ((hash<google::protobuf::MapKey> *)this,(MapKey *)node);
    InsertUnique(&iStack_38,this,this->num_buckets_ - 1 & sVar2 + this->seed_,node);
    node = pNVar1;
  } while (pNVar1 != (Node *)0x0);
  return;
}

Assistant:

void TransferList(void* const* table, size_type index) {
      Node* node = static_cast<Node*>(table[index]);
      do {
        Node* next = node->next;
        InsertUnique(BucketNumber(*KeyPtrFromNodePtr(node)), node);
        node = next;
      } while (node != NULL);
    }